

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_context_build(secp256k1_ecmult_gen_context *ctx,void **prealloc)

{
  secp256k1_ge_storage (*paasVar1) [64] [16];
  undefined1 auStack_362b8 [8];
  secp256k1_gej numsbase;
  secp256k1_gej gbase;
  secp256k1_gej precj [1024];
  undefined1 auStack_161b0 [4];
  int r;
  secp256k1_ge nums_ge;
  secp256k1_fe nums_x;
  void *base;
  size_t prealloc_size;
  int j;
  int i;
  secp256k1_gej nums_gej;
  secp256k1_gej gj;
  secp256k1_ge prec [1024];
  void **prealloc_local;
  secp256k1_ecmult_gen_context *ctx_local;
  
  if (ctx->prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    paasVar1 = (secp256k1_ge_storage (*) [64] [16])manual_alloc(prealloc,0x10000,*prealloc,0x10000);
    ctx->prec = paasVar1;
    secp256k1_gej_set_ge((secp256k1_gej *)&nums_gej.infinity,&secp256k1_ge_const_g);
    secp256k1_fe_set_b32((secp256k1_fe *)&nums_ge.infinity,"The scalar for this x is unknown");
    secp256k1_ge_set_xo_var((secp256k1_ge *)auStack_161b0,(secp256k1_fe *)&nums_ge.infinity,0);
    secp256k1_gej_set_ge((secp256k1_gej *)&j,(secp256k1_ge *)auStack_161b0);
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)&j,(secp256k1_gej *)&j,&secp256k1_ge_const_g,(secp256k1_fe *)0x0);
    memcpy(&numsbase.infinity,&nums_gej.infinity,0x80);
    memcpy(auStack_362b8,&j,0x80);
    for (prealloc_size._0_4_ = 0; (int)prealloc_size < 0x40;
        prealloc_size._0_4_ = (int)prealloc_size + 1) {
      memcpy(&precj[(long)((int)prealloc_size << 4) + -1].infinity,auStack_362b8,0x80);
      for (prealloc_size._4_4_ = 1; prealloc_size._4_4_ < 0x10;
          prealloc_size._4_4_ = prealloc_size._4_4_ + 1) {
        secp256k1_gej_add_var
                  ((secp256k1_gej *)
                   &precj[(long)((int)prealloc_size * 0x10 + prealloc_size._4_4_) + -1].infinity,
                   (secp256k1_gej *)
                   &precj[(long)((int)prealloc_size * 0x10 + prealloc_size._4_4_ + -1) + -1].
                    infinity,(secp256k1_gej *)&numsbase.infinity,(secp256k1_fe *)0x0);
      }
      for (prealloc_size._4_4_ = 0; prealloc_size._4_4_ < 4;
          prealloc_size._4_4_ = prealloc_size._4_4_ + 1) {
        secp256k1_gej_double_var
                  ((secp256k1_gej *)&numsbase.infinity,(secp256k1_gej *)&numsbase.infinity,
                   (secp256k1_fe *)0x0);
      }
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_362b8,(secp256k1_gej *)auStack_362b8,(secp256k1_fe *)0x0);
      if ((int)prealloc_size == 0x3e) {
        secp256k1_gej_neg((secp256k1_gej *)auStack_362b8,(secp256k1_gej *)auStack_362b8);
        secp256k1_gej_add_var
                  ((secp256k1_gej *)auStack_362b8,(secp256k1_gej *)auStack_362b8,(secp256k1_gej *)&j
                   ,(secp256k1_fe *)0x0);
      }
    }
    secp256k1_ge_set_all_gej_var
              ((secp256k1_ge *)&gj.infinity,(secp256k1_gej *)&gbase.infinity,0x400);
    for (prealloc_size._0_4_ = 0; (int)prealloc_size < 0x40;
        prealloc_size._0_4_ = (int)prealloc_size + 1) {
      for (prealloc_size._4_4_ = 0; prealloc_size._4_4_ < 0x10;
          prealloc_size._4_4_ = prealloc_size._4_4_ + 1) {
        secp256k1_ge_to_storage
                  ((*ctx->prec)[(int)prealloc_size] + prealloc_size._4_4_,
                   (secp256k1_ge *)
                   &prec[(long)((int)prealloc_size * 0x10 + prealloc_size._4_4_) + -1].infinity);
      }
    }
    secp256k1_ecmult_gen_blind(ctx,(uchar *)0x0);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_context_build(secp256k1_ecmult_gen_context *ctx, void **prealloc) {
#ifndef USE_ECMULT_STATIC_PRECOMPUTATION
    secp256k1_ge prec[ECMULT_GEN_PREC_N * ECMULT_GEN_PREC_G];
    secp256k1_gej gj;
    secp256k1_gej nums_gej;
    int i, j;
    size_t const prealloc_size = SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE;
    void* const base = *prealloc;
#endif

    if (ctx->prec != NULL) {
        return;
    }
#ifndef USE_ECMULT_STATIC_PRECOMPUTATION
    ctx->prec = (secp256k1_ge_storage (*)[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G])manual_alloc(prealloc, prealloc_size, base, prealloc_size);

    /* get the generator */
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);

    /* Construct a group element with no known corresponding scalar (nothing up my sleeve). */
    {
        static const unsigned char nums_b32[33] = "The scalar for this x is unknown";
        secp256k1_fe nums_x;
        secp256k1_ge nums_ge;
        int r;
        r = secp256k1_fe_set_b32(&nums_x, nums_b32);
        (void)r;
        VERIFY_CHECK(r);
        r = secp256k1_ge_set_xo_var(&nums_ge, &nums_x, 0);
        (void)r;
        VERIFY_CHECK(r);
        secp256k1_gej_set_ge(&nums_gej, &nums_ge);
        /* Add G to make the bits in x uniformly distributed. */
        secp256k1_gej_add_ge_var(&nums_gej, &nums_gej, &secp256k1_ge_const_g, NULL);
    }

    /* compute prec. */
    {
        secp256k1_gej precj[ECMULT_GEN_PREC_N * ECMULT_GEN_PREC_G]; /* Jacobian versions of prec. */
        secp256k1_gej gbase;
        secp256k1_gej numsbase;
        gbase = gj; /* PREC_G^j * G */
        numsbase = nums_gej; /* 2^j * nums. */
        for (j = 0; j < ECMULT_GEN_PREC_N; j++) {
            /* Set precj[j*PREC_G .. j*PREC_G+(PREC_G-1)] to (numsbase, numsbase + gbase, ..., numsbase + (PREC_G-1)*gbase). */
            precj[j*ECMULT_GEN_PREC_G] = numsbase;
            for (i = 1; i < ECMULT_GEN_PREC_G; i++) {
                secp256k1_gej_add_var(&precj[j*ECMULT_GEN_PREC_G + i], &precj[j*ECMULT_GEN_PREC_G + i - 1], &gbase, NULL);
            }
            /* Multiply gbase by PREC_G. */
            for (i = 0; i < ECMULT_GEN_PREC_B; i++) {
                secp256k1_gej_double_var(&gbase, &gbase, NULL);
            }
            /* Multiply numbase by 2. */
            secp256k1_gej_double_var(&numsbase, &numsbase, NULL);
            if (j == ECMULT_GEN_PREC_N - 2) {
                /* In the last iteration, numsbase is (1 - 2^j) * nums instead. */
                secp256k1_gej_neg(&numsbase, &numsbase);
                secp256k1_gej_add_var(&numsbase, &numsbase, &nums_gej, NULL);
            }
        }
        secp256k1_ge_set_all_gej_var(prec, precj, ECMULT_GEN_PREC_N * ECMULT_GEN_PREC_G);
    }
    for (j = 0; j < ECMULT_GEN_PREC_N; j++) {
        for (i = 0; i < ECMULT_GEN_PREC_G; i++) {
            secp256k1_ge_to_storage(&(*ctx->prec)[j][i], &prec[j*ECMULT_GEN_PREC_G + i]);
        }
    }
#else
    (void)prealloc;
    ctx->prec = (secp256k1_ge_storage (*)[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G])secp256k1_ecmult_static_context;
#endif
    secp256k1_ecmult_gen_blind(ctx, NULL);
}